

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::CanConstructByZeroing
               (FieldDescriptor *field,Options *options)

{
  bool bVar1;
  CppType CVar2;
  undefined1 local_1b;
  undefined1 local_1a;
  bool ret;
  Options *options_local;
  FieldDescriptor *field_local;
  
  bVar1 = CanInitializeByZeroing(field);
  local_1a = true;
  if (!bVar1) {
    bVar1 = FieldDescriptor::is_repeated(field);
    local_1b = false;
    if (!bVar1) {
      CVar2 = FieldDescriptor::cpp_type(field);
      local_1b = CVar2 == CPPTYPE_MESSAGE;
    }
    local_1a = local_1b;
  }
  return local_1a;
}

Assistant:

bool CanConstructByZeroing(const FieldDescriptor* field,
                           const Options& options) {
  bool ret = CanInitializeByZeroing(field);

  // Non-repeated, non-lazy message fields are simply raw pointers, so we can
  // use memset to initialize these in SharedCtor.  We cannot use this in
  // Clear, as we need to potentially delete the existing value.
  ret = ret ||
      (!field->is_repeated() &&
       field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  return ret;
}